

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCVT(DisasContext_conflict1 *s,arg_VCVT *a)

{
  byte bVar1;
  int reg;
  int reg_00;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var2;
  int val;
  TCGv_ptr arg2;
  TCGv_i32 arg2_00;
  TCGv_i32 retval;
  TCGv_i64 var;
  TCGv_i64 retval_00;
  TCGv_i32 pTVar3;
  TCGv_i32 retval_01;
  bool bVar4;
  bool bVar5;
  TCGv_i32 tcg_res_1;
  TCGv_i32 tcg_single;
  TCGv_i32 tcg_tmp;
  TCGv_i64 tcg_res;
  TCGv_i64 tcg_double;
  _Bool is_signed;
  int rounding;
  TCGv_i32 tcg_shift;
  TCGv_i32 tcg_rmode;
  TCGv_ptr fpst;
  _Bool dp;
  uint32_t rm;
  uint32_t rd;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCVT *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar4 = a->dp != 0;
  bVar1 = "\x04"[a->rm];
  bVar5 = a->op == 0;
  _Var2 = isar_feature_aa32_vcvt_dr(s->isar);
  if (_Var2) {
    if ((bVar4) && (_Var2 = isar_feature_aa32_fpdp_v2(s->isar), !_Var2)) {
      return false;
    }
    if (((bVar4) && (_Var2 = isar_feature_aa32_simd_r32(s->isar), !_Var2)) && ((a->vm & 0x10U) != 0)
       ) {
      return false;
    }
    reg = a->vd;
    reg_00 = a->vm;
    _Var2 = vfp_access_check(s);
    if (_Var2) {
      arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
      arg2_00 = tcg_const_i32_aarch64(tcg_ctx_00,0);
      val = arm_rmode_to_sf_aarch64((uint)bVar1);
      retval = tcg_const_i32_aarch64(tcg_ctx_00,val);
      gen_helper_set_rmode(tcg_ctx_00,retval,retval,arg2);
      if (bVar4) {
        var = tcg_temp_new_i64(tcg_ctx_00);
        retval_00 = tcg_temp_new_i64(tcg_ctx_00);
        pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
        neon_load_reg64(tcg_ctx_00,var,reg_00);
        if (bVar5) {
          gen_helper_vfp_tould(tcg_ctx_00,retval_00,var,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_tosld(tcg_ctx_00,retval_00,var,arg2_00,arg2);
        }
        tcg_gen_extrl_i64_i32_aarch64(tcg_ctx_00,pTVar3,retval_00);
        neon_store_reg32(tcg_ctx_00,pTVar3,reg);
        tcg_temp_free_i32(tcg_ctx_00,pTVar3);
        tcg_temp_free_i64(tcg_ctx_00,retval_00);
        tcg_temp_free_i64(tcg_ctx_00,var);
      }
      else {
        pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
        retval_01 = tcg_temp_new_i32(tcg_ctx_00);
        neon_load_reg32(tcg_ctx_00,pTVar3,reg_00);
        if (bVar5) {
          gen_helper_vfp_touls(tcg_ctx_00,retval_01,pTVar3,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_tosls(tcg_ctx_00,retval_01,pTVar3,arg2_00,arg2);
        }
        neon_store_reg32(tcg_ctx_00,retval_01,reg);
        tcg_temp_free_i32(tcg_ctx_00,retval_01);
        tcg_temp_free_i32(tcg_ctx_00,pTVar3);
      }
      gen_helper_set_rmode(tcg_ctx_00,retval,retval,arg2);
      tcg_temp_free_i32(tcg_ctx_00,retval);
      tcg_temp_free_i32(tcg_ctx_00,arg2_00);
      tcg_temp_free_ptr(tcg_ctx_00,arg2);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCVT(DisasContext *s, arg_VCVT *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t rd, rm;
    bool dp = a->dp;
    TCGv_ptr fpst;
    TCGv_i32 tcg_rmode, tcg_shift;
    int rounding = fp_decode_rm[a->rm];
    bool is_signed = a->op;

    if (!dc_isar_feature(aa32_vcvt_dr, s)) {
        return false;
    }

    if (dp && !dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (dp && !dc_isar_feature(aa32_simd_r32, s) && (a->vm & 0x10)) {
        return false;
    }

    rd = a->vd;
    rm = a->vm;

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    tcg_shift = tcg_const_i32(tcg_ctx, 0);

    tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rounding));
    gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, fpst);

    if (dp) {
        TCGv_i64 tcg_double, tcg_res;
        TCGv_i32 tcg_tmp;
        tcg_double = tcg_temp_new_i64(tcg_ctx);
        tcg_res = tcg_temp_new_i64(tcg_ctx);
        tcg_tmp = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg64(tcg_ctx, tcg_double, rm);
        if (is_signed) {
            gen_helper_vfp_tosld(tcg_ctx, tcg_res, tcg_double, tcg_shift, fpst);
        } else {
            gen_helper_vfp_tould(tcg_ctx, tcg_res, tcg_double, tcg_shift, fpst);
        }
        tcg_gen_extrl_i64_i32(tcg_ctx, tcg_tmp, tcg_res);
        neon_store_reg32(tcg_ctx, tcg_tmp, rd);
        tcg_temp_free_i32(tcg_ctx, tcg_tmp);
        tcg_temp_free_i64(tcg_ctx, tcg_res);
        tcg_temp_free_i64(tcg_ctx, tcg_double);
    } else {
        TCGv_i32 tcg_single, tcg_res;
        tcg_single = tcg_temp_new_i32(tcg_ctx);
        tcg_res = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, tcg_single, rm);
        if (is_signed) {
            gen_helper_vfp_tosls(tcg_ctx, tcg_res, tcg_single, tcg_shift, fpst);
        } else {
            gen_helper_vfp_touls(tcg_ctx, tcg_res, tcg_single, tcg_shift, fpst);
        }
        neon_store_reg32(tcg_ctx, tcg_res, rd);
        tcg_temp_free_i32(tcg_ctx, tcg_res);
        tcg_temp_free_i32(tcg_ctx, tcg_single);
    }

    gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, fpst);
    tcg_temp_free_i32(tcg_ctx, tcg_rmode);

    tcg_temp_free_i32(tcg_ctx, tcg_shift);

    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}